

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

shared_ptr<QPDFJob::CopyAttConfig> __thiscall QPDFJob::Config::copyAttachmentsFrom(Config *this)

{
  CopyAttConfig *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Config *in_RSI;
  shared_ptr<QPDFJob::CopyAttConfig> sVar1;
  
  __p = (CopyAttConfig *)operator_new(0x68);
  __p->config = in_RSI;
  (__p->caf).path._M_dataplus._M_p = (pointer)&(__p->caf).path.field_2;
  (__p->caf).path._M_string_length = 0;
  (__p->caf).path.field_2._M_local_buf[0] = '\0';
  (__p->caf).password._M_dataplus._M_p = (pointer)&(__p->caf).password.field_2;
  (__p->caf).password._M_string_length = 0;
  (__p->caf).password.field_2._M_local_buf[0] = '\0';
  (__p->caf).prefix._M_dataplus._M_p = (pointer)&(__p->caf).prefix.field_2;
  (__p->caf).prefix._M_string_length = 0;
  (__p->caf).prefix.field_2._M_local_buf[0] = '\0';
  this->o = (QPDFJob *)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QPDFJob::CopyAttConfig*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 1),__p);
  sVar1.super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<QPDFJob::CopyAttConfig>)
         sVar1.super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFJob::CopyAttConfig>
QPDFJob::Config::copyAttachmentsFrom()
{
    return std::shared_ptr<CopyAttConfig>(new CopyAttConfig(this));
}